

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::HttpHeaders::Request> * __thiscall
kj::HttpHeaders::tryParseRequest
          (Maybe<kj::HttpHeaders::Request> *__return_storage_ptr__,HttpHeaders *this,
          ArrayPtr<char> content)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  char *end;
  char *ptr;
  char *local_58;
  size_t local_50;
  kj local_48 [4];
  HttpMethod local_44;
  char *local_40;
  size_t local_38;
  
  uVar3 = content.size_;
  local_58 = content.ptr;
  if ((1 < uVar3) && (local_58[uVar3 - 1] == '\n')) {
    lVar1 = uVar3 - 1;
    if (local_58[uVar3 - 2] == '\r') {
      lVar1 = uVar3 - 2;
    }
    end = local_58 + lVar1;
    local_58[~(ulong)(local_58[uVar3 - 2] == '\r') + uVar3] = '\0';
    consumeHttpMethod(local_48,&local_58);
    if ((local_48[0] == (kj)0x1) && ((*local_58 == ' ' || (*local_58 == '\t')))) {
      local_58 = local_58 + 1;
      consumeWord(&local_58);
      if (local_48[0] == (kj)0x1) {
        local_50 = local_38;
        consumeLine(&local_58);
        bVar2 = parseHeaders(this,local_58,end);
        if (bVar2) {
          (__return_storage_ptr__->ptr).isSet = true;
          (__return_storage_ptr__->ptr).field_1.value.method = local_44;
          (__return_storage_ptr__->ptr).field_1.value.url.content.ptr = local_40;
          (__return_storage_ptr__->ptr).field_1.value.url.content.size_ = local_50;
          return __return_storage_ptr__;
        }
      }
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<HttpHeaders::Request> HttpHeaders::tryParseRequest(kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) return nullptr;

  char* ptr = content.begin();

  HttpHeaders::Request request;

  KJ_IF_MAYBE(method, consumeHttpMethod(ptr)) {
    request.method = *method;
    if (*ptr != ' ' && *ptr != '\t') {
      return nullptr;
    }
    ++ptr;
  } else {
    return nullptr;
  }

  KJ_IF_MAYBE(path, consumeWord(ptr)) {
    request.url = *path;
  } else {
    return nullptr;
  }

  // Ignore rest of line. Don't care about "HTTP/1.1" or whatever.
  consumeLine(ptr);

  if (!parseHeaders(ptr, end)) return nullptr;

  return request;
}